

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# factory.h
# Opt level: O1

void yyml::Factory<yyml::nn::Variable<double>_>::RemoveInstance(Variable<double> *instance)

{
  _Base_ptr p_Var1;
  register_type *prVar2;
  _Rb_tree_header *p_Var3;
  _Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
  *this;
  _Base_ptr p_Var4;
  const_iterator __position;
  
  if (instance != (Variable<double> *)0x0) {
    prVar2 = registry();
    p_Var3 = &(prVar2->_M_t)._M_impl.super__Rb_tree_header;
    p_Var1 = (prVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
    p_Var4 = &p_Var3->_M_header;
    for (; p_Var1 != (_Base_ptr)0x0;
        p_Var1 = (&p_Var1->_M_left)[*(Variable<double> **)(p_Var1 + 1) < instance]) {
      if (*(Variable<double> **)(p_Var1 + 1) >= instance) {
        p_Var4 = p_Var1;
      }
    }
    if (((_Rb_tree_header *)p_Var4 != p_Var3) && (instance < *(Variable<double> **)(p_Var4 + 1))) {
      p_Var4 = &p_Var3->_M_header;
    }
    prVar2 = registry();
    if ((_Rb_tree_header *)p_Var4 != &(prVar2->_M_t)._M_impl.super__Rb_tree_header) {
      prVar2 = registry();
      p_Var3 = &(prVar2->_M_t)._M_impl.super__Rb_tree_header;
      p_Var1 = (prVar2->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent;
      __position._M_node = &p_Var3->_M_header;
      for (; p_Var1 != (_Base_ptr)0x0;
          p_Var1 = (&p_Var1->_M_left)[*(Variable<double> **)(p_Var1 + 1) < instance]) {
        if (*(Variable<double> **)(p_Var1 + 1) >= instance) {
          __position._M_node = p_Var1;
        }
      }
      if (((_Rb_tree_header *)__position._M_node != p_Var3) &&
         (instance < *(Variable<double> **)(__position._M_node + 1))) {
        __position._M_node = &p_Var3->_M_header;
      }
      this = (_Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
              *)registry();
      std::
      _Rb_tree<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>,std::_Identity<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>,yyml::detail::PointerComp<yyml::nn::Variable<double>>,std::allocator<std::unique_ptr<yyml::nn::Variable<double>,std::default_delete<yyml::nn::Variable<double>>>>>
      ::erase_abi_cxx11_(this,__position);
      return;
    }
  }
  return;
}

Assistant:

static void RemoveInstance(Type *instance) {
    if (instance != nullptr && registry().find(instance) != registry().end()) {
      auto iter = registry().find(instance);
      registry().erase(iter);
    }
  }